

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.h
# Opt level: O0

void lumeview::MessageQueue::
     post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
               (SubsetInfoAnnex **args,uint *args_1,bool *args_2,bool *args_3)

{
  shared_ptr<lumeview::SubsetInfoAnnexMessage> local_48;
  shared_ptr<const_lumeview::Message> local_38;
  bool *local_28;
  bool *args_local_3;
  bool *args_local_2;
  uint *args_local_1;
  SubsetInfoAnnex **args_local;
  
  local_28 = args_3;
  args_local_3 = args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (uint *)args;
  std::make_shared<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
            ((SubsetInfoAnnex **)&local_48,(uint *)args,(bool *)args_1,args_2);
  std::shared_ptr<lumeview::Message_const>::shared_ptr<lumeview::SubsetInfoAnnexMessage,void>
            ((shared_ptr<lumeview::Message_const> *)&local_38,&local_48);
  post(&local_38);
  std::shared_ptr<const_lumeview::Message>::~shared_ptr(&local_38);
  std::shared_ptr<lumeview::SubsetInfoAnnexMessage>::~shared_ptr(&local_48);
  return;
}

Assistant:

static void post (TArgs&&... args)
	{
		post (std::make_shared <TMsg> (std::forward<TArgs>(args)...));
	}